

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsDefinePropertyCommon
          (ScriptContext *scriptContext,JsValueRef object,PropertyRecord *propertyRecord,
          JsValueRef propertyDescriptor,bool *result)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *obj;
  JsErrorCode JVar5;
  undefined1 local_68 [8];
  PropertyDescriptor propertyDescriptorValue;
  
  propertyDescriptorValue._40_8_ = result;
  if (scriptContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x75f,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_68);
  BVar3 = Js::JavascriptOperators::ToPropertyDescriptor
                    (propertyDescriptor,(PropertyDescriptor *)local_68,scriptContext);
  if (BVar3 == 0) {
    JVar5 = JsErrorInvalidArgument;
  }
  else {
    obj = Js::VarTo<Js::RecyclableObject>(object);
    JVar5 = JsNoError;
    BVar3 = Js::JavascriptOperators::DefineOwnPropertyDescriptor
                      (obj,propertyRecord->pid,(PropertyDescriptor *)local_68,true,scriptContext,
                       PropertyOperation_None);
    *(bool *)propertyDescriptorValue._40_8_ = BVar3 != 0;
  }
  return JVar5;
}

Assistant:

static JsErrorCode JsDefinePropertyCommon(Js::ScriptContext * scriptContext, _In_ JsValueRef object,
    _In_ const Js::PropertyRecord *propertyRecord, _In_ JsValueRef propertyDescriptor,
    _Out_ bool *result)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    Js::PropertyDescriptor propertyDescriptorValue;
    if (!Js::JavascriptOperators::ToPropertyDescriptor(propertyDescriptor, &propertyDescriptorValue, scriptContext))
    {
        return JsErrorInvalidArgument;
    }

    *result = Js::JavascriptOperators::DefineOwnPropertyDescriptor(
        Js::VarTo<Js::RecyclableObject>(object), propertyRecord->GetPropertyId(),
        propertyDescriptorValue, true, scriptContext) != 0;

    return JsNoError;
}